

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZZ.hpp
# Opt level: O0

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::RotationZZ<std::complex<float>_>::matrix(RotationZZ<std::complex<float>_> *this)

{
  complex<float> m32;
  complex<float> m01;
  data_type extraout_RDX;
  complex<float> in_RSI;
  complex<float> in_R8;
  complex<float> in_R9;
  float __r;
  double in_XMM0_Qa;
  double dVar1;
  double __x;
  double dVar2;
  SquareMatrix<std::complex<float>_> SVar3;
  complex<float> in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  complex<float> m33;
  complex<float> local_a0;
  complex<float> local_98;
  complex<float> local_90;
  complex<float> local_88;
  complex<float> local_80;
  complex<float> local_78;
  complex<float> local_70;
  complex<float> local_68;
  complex<float> local_60;
  _ComplexT local_58;
  complex<float> local_50;
  complex<float> local_48;
  complex<float> local_40;
  complex<float> local_38;
  _ComplexT local_30;
  complex<float> local_28;
  complex<float> b;
  complex<float> a;
  RotationZZ<std::complex<float>_> *this_local;
  
  m33._M_value = in_RSI._M_value;
  dVar1 = QRotationGate2<std::complex<float>_>::cos
                    ((QRotationGate2<std::complex<float>_> *)in_RSI._M_value,in_XMM0_Qa);
  __r = SUB84(dVar1,0);
  dVar1 = QRotationGate2<std::complex<float>_>::sin
                    ((QRotationGate2<std::complex<float>_> *)m33._M_value,dVar1);
  std::complex<float>::complex(&b,__r,-SUB84(dVar1,0));
  dVar1 = QRotationGate2<std::complex<float>_>::cos
                    ((QRotationGate2<std::complex<float>_> *)m33._M_value,__x);
  dVar2 = QRotationGate2<std::complex<float>_>::sin
                    ((QRotationGate2<std::complex<float>_> *)m33._M_value,dVar1);
  std::complex<float>::complex(&local_28,SUB84(dVar1,0),SUB84(dVar2,0));
  local_30 = b._M_value;
  std::complex<float>::complex(&local_38,0.0,0.0);
  std::complex<float>::complex(&local_40,0.0,0.0);
  std::complex<float>::complex(&local_48,0.0,0.0);
  std::complex<float>::complex(&local_50,0.0,0.0);
  local_58 = local_28._M_value;
  std::complex<float>::complex(&local_60,0.0,0.0);
  std::complex<float>::complex(&local_68,0.0,0.0);
  std::complex<float>::complex(&local_70,0.0,0.0);
  std::complex<float>::complex(&local_78,0.0,0.0);
  local_80._M_value = local_28._M_value;
  std::complex<float>::complex(&local_88,0.0,0.0);
  std::complex<float>::complex(&local_90,0.0,0.0);
  std::complex<float>::complex(&local_98,0.0,0.0);
  std::complex<float>::complex(&local_a0,0.0,0.0);
  m32._M_value._4_4_ = __r;
  m32._M_value._0_4_ = in_stack_ffffffffffffff30;
  dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)this,in_RSI,m01,local_70,in_R8,in_R9,local_70,
             local_78,local_80,local_88,local_90,local_98,local_a0,b,in_stack_ffffffffffffff28,m32,
             m33);
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T a = T(this->cos(),-this->sin()) ;
          const T b = T(this->cos(), this->sin()) ;
          return qclab::dense::SquareMatrix< T >( a , 0 , 0 , 0 ,
                                                  0 , b , 0 , 0 ,
                                                  0 , 0 , b , 0 ,
                                                  0 , 0 , 0 , a ) ;
        }